

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceType.h
# Opt level: O1

optional<libchess::PieceType> libchess::PieceType::from(char c)

{
  ulong uVar1;
  ulong uVar2;
  undefined3 in_register_00000039;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000039,c);
  uVar2 = 0x100000000;
  uVar1 = 0;
  if (iVar3 < 0x62) {
    switch(iVar3) {
    case 0x4b:
switchD_00107fab_caseD_4b:
      uVar1 = 5;
      goto switchD_00107fab_caseD_50;
    case 0x4c:
    case 0x4d:
    case 0x4f:
      break;
    case 0x4e:
switchD_00107fab_caseD_4e:
      uVar1 = 1;
    case 0x50:
      goto switchD_00107fab_caseD_50;
    case 0x51:
switchD_00107fab_caseD_51:
      uVar1 = 4;
      goto switchD_00107fab_caseD_50;
    case 0x52:
switchD_00107fab_caseD_52:
      uVar1 = 3;
      goto switchD_00107fab_caseD_50;
    default:
      if (iVar3 == 0x42) {
LAB_00107ff1:
        uVar1 = 2;
        goto switchD_00107fab_caseD_50;
      }
    }
  }
  else {
    switch(iVar3) {
    case 0x6b:
      goto switchD_00107fab_caseD_4b;
    case 0x6c:
    case 0x6d:
    case 0x6f:
      break;
    case 0x6e:
      goto switchD_00107fab_caseD_4e;
    case 0x70:
      goto switchD_00107fab_caseD_50;
    case 0x71:
      goto switchD_00107fab_caseD_51;
    case 0x72:
      goto switchD_00107fab_caseD_52;
    default:
      if (iVar3 == 0x62) goto LAB_00107ff1;
    }
  }
  uVar1 = 0;
  uVar2 = 0;
switchD_00107fab_caseD_50:
  return (optional<libchess::PieceType>)(uVar1 | uVar2);
}

Assistant:

constexpr static std::optional<PieceType> from(char c) {
        switch (c) {
        case 'p':
        case 'P':
            return PieceType{Value::PAWN};
        case 'n':
        case 'N':
            return PieceType{Value::KNIGHT};
        case 'b':
        case 'B':
            return PieceType{Value::BISHOP};
        case 'r':
        case 'R':
            return PieceType{Value::ROOK};
        case 'q':
        case 'Q':
            return PieceType{Value::QUEEN};
        case 'k':
        case 'K':
            return PieceType{Value::KING};
        default:
            return {};
        }
    }